

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8_t * google::protobuf::internal::
          MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
          ::InternalSerialize(int field_number,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                             double *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  double dVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar7 = field_number << 3;
  *ptr = (byte)uVar7 + 2;
  if (uVar7 < 0x80) {
    pbVar5 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar7 | 0x82;
    ptr[1] = (byte)(uVar7 >> 7);
    pbVar5 = ptr + 2;
    if (0x3fff < uVar7) {
      uVar6 = (uint)ptr[1];
      uVar7 = uVar7 >> 7;
      do {
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar6 = uVar7 >> 7;
        *pbVar5 = (byte)uVar6;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar2);
    }
  }
  uVar7 = (uint)key->_M_string_length;
  uVar6 = uVar7 | 1;
  iVar3 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  uVar7 = (iVar3 * 9 + 0x49U >> 6) + uVar7 + 10;
  *pbVar5 = (byte)uVar7;
  if (uVar7 < 0x80) {
    pbVar4 = pbVar5 + 1;
  }
  else {
    *pbVar5 = (byte)uVar7 | 0x80;
    pbVar5[1] = (byte)(uVar7 >> 7);
    pbVar4 = pbVar5 + 2;
    if (0x3fff < uVar7) {
      uVar6 = (uint)pbVar5[1];
      uVar7 = uVar7 >> 7;
      do {
        pbVar4[-1] = (byte)uVar6 | 0x80;
        uVar6 = uVar7 >> 7;
        *pbVar4 = (byte)uVar6;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar2);
    }
  }
  if (stream->end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar4);
  }
  __n = key->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)pbVar4)))) {
    *pbVar4 = 10;
    pbVar4[1] = (byte)__n;
    memcpy(pbVar4 + 2,(key->_M_dataplus)._M_p,__n);
    pbVar4 = pbVar4 + __n + 2;
  }
  else {
    pbVar4 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,key,pbVar4);
  }
  if (stream->end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar4);
  }
  dVar1 = *value;
  *pbVar4 = 0x11;
  *(double *)(pbVar4 + 1) = dVar1;
  return pbVar4 + 9;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }